

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O3

void JSONWorker::UnfixString(json_string *value_t,bool flag,json_string *res)

{
  byte bVar1;
  pointer pcVar2;
  size_type sVar3;
  json_string *extraout_RDX;
  json_string *pjVar4;
  json_string *extraout_RDX_00;
  json_string *extraout_RDX_01;
  json_string *extraout_RDX_02;
  size_type sVar5;
  undefined7 in_register_00000031;
  json_string local_50;
  
  pcVar2 = (value_t->_M_dataplus)._M_p;
  sVar3 = value_t->_M_string_length;
  if ((int)CONCAT71(in_register_00000031,flag) == 0) {
    std::__cxx11::string::_M_append((char *)res,(ulong)pcVar2);
  }
  else if (sVar3 != 0) {
    sVar5 = 0;
    pjVar4 = res;
    do {
      bVar1 = pcVar2[sVar5];
      if (0x21 < bVar1) {
        if (((bVar1 != 0x5c) && (bVar1 != 0x2f)) && (bVar1 != 0x22)) goto switchD_001159b2_caseD_b;
        goto LAB_00115a03;
      }
      switch(bVar1) {
      case 8:
        break;
      case 9:
        break;
      case 10:
        break;
      default:
switchD_001159b2_caseD_b:
        if ((byte)(bVar1 + 0x81) < 0xa1) {
          toUTF8_abi_cxx11_(&local_50,(JSONWorker *)(ulong)bVar1,(uchar)pjVar4);
          std::__cxx11::string::_M_append((char *)res,(ulong)local_50._M_dataplus._M_p);
          pjVar4 = extraout_RDX_01;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
            pjVar4 = extraout_RDX_02;
          }
        }
        else {
          std::__cxx11::string::push_back((char)res);
          pjVar4 = extraout_RDX_00;
        }
        goto LAB_00115a0e;
      case 0xc:
        break;
      case 0xd:
      }
LAB_00115a03:
      std::__cxx11::string::append((char *)res);
      pjVar4 = extraout_RDX;
LAB_00115a0e:
      sVar5 = sVar5 + 1;
    } while (sVar3 != sVar5);
  }
  return;
}

Assistant:

void JSONWorker::UnfixString(const json_string & value_t, bool flag, json_string & res) json_nothrow {
    if (!flag){
		res += value_t;
		return;
	}
    //Re-escapes a json_string so that it can be written out into a JSON file
	const json_char * const end = value_t.data() + value_t.length();
    for(const json_char * p = value_t.data(); p != end; ++p){
	   switch(*p){
		  case JSON_TEXT('\"'):  //quote character
			 res += JSON_TEXT("\\\"");
			 break;
		  case JSON_TEXT('\\'):	//backslash
			 res += JSON_TEXT("\\\\");
			 break;
		  #ifdef JSON_ESCAPE_WRITES
			 case JSON_TEXT('\t'):	//tab character
				res += JSON_TEXT("\\t");
				break;
			 case JSON_TEXT('\n'):	//newline character
				res += JSON_TEXT("\\n");
				break;
			 case JSON_TEXT('\r'):	//return character
				res += JSON_TEXT("\\r");
				break;
			 case JSON_TEXT('/'):	//forward slash
				res += JSON_TEXT("\\/");
				break;
			 case JSON_TEXT('\b'):	//backspace
				res += JSON_TEXT("\\b");
				break;
			 case JSON_TEXT('\f'):	//formfeed
				res += JSON_TEXT("\\f");
				break;
			 default:
			 {
				if (json_unlikely(((json_uchar)(*p) < 32) || ((json_uchar)(*p) > 126))){
				    res += toUTF8((json_uchar)(*p));
				} else {
				    res += *p;
				}
			}
				break;
		  #else
			 default:
				res += *p;
				break;
		  #endif
	   }
    }
}